

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_regular_transfer(connectdata *conn,_Bool *dophase_done)

{
  SessionHandle *data_00;
  SessionHandle *data;
  _Bool connected;
  _Bool *p_Stack_18;
  CURLcode result;
  _Bool *dophase_done_local;
  connectdata *conn_local;
  
  data._4_4_ = 0;
  data._3_1_ = 0;
  data_00 = conn->data;
  (data_00->req).size = -1;
  p_Stack_18 = dophase_done;
  dophase_done_local = (_Bool *)conn;
  Curl_pgrsSetUploadCounter(data_00,0);
  Curl_pgrsSetDownloadCounter(data_00,0);
  Curl_pgrsSetUploadSize(data_00,-1);
  Curl_pgrsSetDownloadSize(data_00,-1);
  data._4_4_ = smtp_perform((connectdata *)dophase_done_local,(_Bool *)((long)&data + 3),p_Stack_18)
  ;
  if ((data._4_4_ == CURLE_OK) && ((*p_Stack_18 & 1U) != 0)) {
    data._4_4_ = smtp_dophase_done((connectdata *)dophase_done_local,(_Bool)(data._3_1_ & 1));
  }
  return data._4_4_;
}

Assistant:

static CURLcode smtp_regular_transfer(struct connectdata *conn,
                                      bool *dophase_done)
{
  CURLcode result = CURLE_OK;
  bool connected = FALSE;
  struct SessionHandle *data = conn->data;

  /* Make sure size is unknown at this point */
  data->req.size = -1;

  /* Set the progress data */
  Curl_pgrsSetUploadCounter(data, 0);
  Curl_pgrsSetDownloadCounter(data, 0);
  Curl_pgrsSetUploadSize(data, -1);
  Curl_pgrsSetDownloadSize(data, -1);

  /* Carry out the perform */
  result = smtp_perform(conn, &connected, dophase_done);

  /* Perform post DO phase operations if necessary */
  if(!result && *dophase_done)
    result = smtp_dophase_done(conn, connected);

  return result;
}